

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O3

void __thiscall
wasm::ToolOptions::ToolOptions(ToolOptions *this,string *command,string *description)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string *psVar4;
  ToolOptions *pTVar5;
  ToolOptions *local_8a8;
  undefined8 local_8a0;
  code *local_898;
  code *local_890;
  ToolOptions *local_888;
  undefined8 local_880;
  code *local_878;
  code *local_870;
  ToolOptions *local_868;
  undefined8 local_860;
  code *local_858;
  code *local_850;
  ToolOptions *local_848;
  undefined8 local_840;
  code *local_838;
  code *local_830;
  ToolOptions *local_828;
  undefined8 local_820;
  code *local_818;
  code *local_810;
  ToolOptions *local_808;
  undefined8 local_800;
  code *local_7f8;
  code *local_7f0;
  ToolOptions *local_7e8;
  undefined8 local_7e0;
  code *local_7d8;
  code *local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  code *local_7b8;
  code *local_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  code *local_798;
  code *local_790;
  long *local_780 [2];
  long local_770 [2];
  long *local_760 [2];
  long local_750 [2];
  long *local_740 [2];
  long local_730 [2];
  long *local_720 [2];
  long local_710 [2];
  long *local_700 [2];
  long local_6f0 [2];
  long *local_6e0 [2];
  long local_6d0 [2];
  long *local_6c0 [2];
  long local_6b0 [2];
  long *local_6a0 [2];
  long local_690 [2];
  long *local_680 [2];
  long local_670 [2];
  long *local_660 [2];
  long local_650 [2];
  long *local_640 [2];
  long local_630 [2];
  long *local_620 [2];
  long local_610 [2];
  long *local_600 [2];
  long local_5f0 [2];
  long *local_5e0 [2];
  long local_5d0 [2];
  long *local_5c0 [2];
  long local_5b0 [2];
  long *local_5a0 [2];
  long local_590 [2];
  long *local_580 [2];
  long local_570 [2];
  long *local_560 [2];
  long local_550 [2];
  long *local_540 [2];
  long local_530 [2];
  long *local_520 [2];
  long local_510 [2];
  long *local_500 [2];
  long local_4f0 [2];
  long *local_4e0 [2];
  long local_4d0 [2];
  long *local_4c0 [2];
  long local_4b0 [2];
  long *local_4a0 [2];
  long local_490 [2];
  long *local_480 [2];
  long local_470 [2];
  long *local_460 [2];
  long local_450 [2];
  long *local_440 [2];
  long local_430 [2];
  long *local_420 [2];
  long local_410 [2];
  long *local_400 [2];
  long local_3f0 [2];
  long *local_3e0 [2];
  long local_3d0 [2];
  long *local_3c0 [2];
  long local_3b0 [2];
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380 [2];
  long local_370 [2];
  string *local_360;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  ToolOptions *local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [24];
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_360 = (string *)&this->super_Options;
  wasm::Options::Options((Options *)local_360,(string *)command,(string *)description);
  this->_vptr_ToolOptions = (_func_int **)&PTR_addPassArg_00125ca0;
  (this->passOptions).debug = false;
  (this->passOptions).validate = true;
  (this->passOptions).validateGlobally = true;
  (this->passOptions).optimizeLevel = 0;
  (this->passOptions).shrinkLevel = 0;
  (this->passOptions).inlining.alwaysInlineMaxSize = 2;
  (this->passOptions).inlining.oneCallerInlineMaxSize = 0xffffffff;
  (this->passOptions).inlining.flexibleInlineMaxSize = 0x14;
  (this->passOptions).inlining.allowFunctionsWithLoops = false;
  (this->passOptions).printStackIR.
  super__Optional_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_true,_true>._M_payload.
  super__Optional_payload_base<std::basic_ostream<char,_std::char_traits<char>_>_*>._M_engaged =
       false;
  (this->passOptions).targetJS = false;
  *(undefined8 *)&(this->passOptions).inlining.partialInliningIfs = 0;
  (this->passOptions).trapsNeverHappen = false;
  (this->passOptions).lowMemoryUnused = false;
  (this->passOptions).fastMath = false;
  (this->passOptions).zeroFilledMemory = false;
  (this->passOptions).closedWorld = false;
  (this->passOptions).debugInfo = false;
  (this->passOptions).generateStackIR = false;
  (this->passOptions).optimizeStackIR = false;
  (this->passOptions).arguments._M_h._M_buckets =
       &(this->passOptions).arguments._M_h._M_single_bucket;
  (this->passOptions).arguments._M_h._M_bucket_count = 1;
  (this->passOptions).arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->passOptions).arguments._M_h._M_element_count = 0;
  (this->passOptions).arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->passOptions).arguments._M_h._M_rehash_policy._M_next_resize = 0;
  (this->passOptions).arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->passOptions).passesToSkip._M_h._M_buckets =
       &(this->passOptions).passesToSkip._M_h._M_single_bucket;
  (this->passOptions).passesToSkip._M_h._M_bucket_count = 1;
  (this->passOptions).passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->passOptions).passesToSkip._M_h._M_element_count = 0;
  (this->passOptions).passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->profile = Normal;
  (this->passOptions).passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
  (this->passOptions).passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->quiet = false;
  this->preserveTypeOrder = false;
  this->enabledFeatures = 0x22;
  this->disabledFeatures = 0;
  paVar1 = &local_2b0.field_2;
  local_2b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"--mvp-features","");
  paVar2 = &local_290.field_2;
  local_290._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"-mvp","");
  paVar3 = &local_270.field_2;
  local_270._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_270,"Disable all non-MVP features","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Tool options","");
  local_358._8_8_ = 0;
  local_348._8_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:47:12)>
       ::_M_invoke;
  local_348._0_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:47:12)>
       ::_M_manager;
  local_358._0_8_ = this;
  psVar4 = (string *)
           wasm::Options::add(local_360,(string *)&local_2b0,(string *)&local_290,
                              (string *)&local_270,(Arguments)&local_250,(function *)0x0,
                              SUB81(local_358,0));
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--all-features","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"-all","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Enable all features","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Tool options","");
  local_338._8_8_ = 0;
  local_328._8_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:56:12)>
       ::_M_invoke;
  local_328._0_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:56:12)>
       ::_M_manager;
  local_338._0_8_ = this;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)&local_230,(string *)&local_210,(string *)&local_1f0,
                              (Arguments)&local_1d0,(function *)0x0,SUB81(local_338,0));
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"--detect-features","");
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,"(deprecated - this flag does nothing)","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Tool options","");
  local_2d8._0_8_ = (pointer)0x0;
  local_2d8._8_8_ = 0;
  local_2c8._8_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:65:12)>
       ::_M_invoke;
  local_2c8._0_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:65:12)>
       ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)&local_1b0,(string *)&local_190,(string *)&local_170,
                              (Arguments)&local_150,(function *)0x0,SUB81(local_2d8,0));
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"--quiet","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"-q","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"Emit less verbose output and hide trivial warnings.","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Tool options","");
  local_318._8_8_ = 0;
  local_308._8_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:71:12)>
       ::_M_invoke;
  local_308._0_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:71:12)>
       ::_M_manager;
  local_318._0_8_ = this;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)&local_130,(string *)&local_110,(string *)&local_f0,
                              (Arguments)&local_d0,(function *)0x0,SUB81(local_318,0));
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"--experimental-poppy","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Parse wast files as Poppy IR for testing purposes.","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Tool options","");
  local_2f0 = 0;
  local_2e8._8_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:78:9)>
       ::_M_invoke;
  local_2e8._0_8_ =
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:78:9)>
       ::_M_manager;
  local_2f8 = this;
  wasm::Options::add(psVar4,(string *)&local_b0,(string *)&local_90,(string *)local_70,
                     (Arguments)local_50,(function *)0x0,SUB81(&local_2f8,0));
  if ((_func_int **)local_2e8._0_8_ != (_func_int **)0x0) {
    (*(code *)local_2e8._0_8_)(&local_2f8,&local_2f8,3);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((code *)local_308._0_8_ != (code *)0x0) {
    (*(code *)local_308._0_8_)(local_318,local_318,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((code *)local_2c8._0_8_ != (code *)0x0) {
    (*(code *)local_2c8._0_8_)(local_2d8,local_2d8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((code *)local_328._0_8_ != (code *)0x0) {
    (*(code *)local_328._0_8_)(local_338,local_338,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((code *)local_348._0_8_ != (code *)0x0) {
    (*(code *)local_348._0_8_)(local_358,local_358,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar3) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  local_2b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,"sign extension operations","");
  pTVar5 = addFeature(this,SignExt,&local_2b0,(FeatureSet)0x0,(FeatureSet)0x0);
  local_290._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"atomic operations","");
  pTVar5 = addFeature(pTVar5,Atomics,&local_290,(FeatureSet)0x0,(FeatureSet)0x0);
  local_270._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"mutable globals","");
  pTVar5 = addFeature(pTVar5,MutableGlobals,&local_270,(FeatureSet)0x0,(FeatureSet)0x0);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_250,"nontrapping float-to-int operations","");
  pTVar5 = addFeature(pTVar5,TruncSat,&local_250,(FeatureSet)0x0,(FeatureSet)0x0);
  local_358._0_8_ = local_348;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,"SIMD operations and types","");
  pTVar5 = addFeature(pTVar5,SIMD,(string *)local_358,(FeatureSet)0x0,(FeatureSet)0x0);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"bulk memory operations","");
  pTVar5 = addFeature(pTVar5,BulkMemory,&local_230,(FeatureSet)0x80000,(FeatureSet)0x0);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,"memory.copy and memory.fill","");
  pTVar5 = addFeature(pTVar5,BulkMemoryOpt,&local_210,(FeatureSet)0x0,(FeatureSet)0x10);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,
             "LEB encoding of call-indirect (Ignored for compatibility as it has no effect on Binaryen)"
             ,"");
  pTVar5 = addFeature(pTVar5,CallIndirectOverlong,&local_1f0,(FeatureSet)0x0,(FeatureSet)0x0);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d0,"exception handling operations","");
  pTVar5 = addFeature(pTVar5,ExceptionHandling,&local_1d0,(FeatureSet)0x0,(FeatureSet)0x0);
  local_338._0_8_ = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"tail call operations","");
  pTVar5 = addFeature(pTVar5,TailCall,(string *)local_338,(FeatureSet)0x0,(FeatureSet)0x0);
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"reference types","");
  pTVar5 = addFeature(pTVar5,ReferenceTypes,&local_1b0,(FeatureSet)0x0,(FeatureSet)0x0);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"multivalue functions","");
  pTVar5 = addFeature(pTVar5,Multivalue,&local_190,(FeatureSet)0x0,(FeatureSet)0x0);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"garbage collection","");
  pTVar5 = addFeature(pTVar5,GC,&local_170,(FeatureSet)0x0,(FeatureSet)0x0);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"memory64","");
  pTVar5 = addFeature(pTVar5,Memory64,&local_150,(FeatureSet)0x0,(FeatureSet)0x0);
  local_2d8._0_8_ = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"relaxed SIMD","");
  pTVar5 = addFeature(pTVar5,RelaxedSIMD,(string *)local_2d8,(FeatureSet)0x0,(FeatureSet)0x0);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"extended const expressions","");
  pTVar5 = addFeature(pTVar5,ExtendedConst,&local_130,(FeatureSet)0x0,(FeatureSet)0x0);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"strings","");
  pTVar5 = addFeature(pTVar5,Strings,&local_110,(FeatureSet)0x0,(FeatureSet)0x0);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"multimemory","");
  pTVar5 = addFeature(pTVar5,MultiMemory,&local_f0,(FeatureSet)0x0,(FeatureSet)0x0);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"stack switching","");
  pTVar5 = addFeature(pTVar5,StackSwitching,&local_d0,(FeatureSet)0x0,(FeatureSet)0x0);
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,"shared-everything threads","");
  pTVar5 = addFeature(pTVar5,SharedEverything,(string *)local_318,(FeatureSet)0x0,(FeatureSet)0x0);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"float 16 operations","");
  pTVar5 = addFeature(pTVar5,FP16,&local_b0,(FeatureSet)0x0,(FeatureSet)0x0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"custom descriptors (RTTs) and exact references","");
  pTVar5 = addFeature(pTVar5,CustomDescriptors,&local_90,(FeatureSet)0x0,(FeatureSet)0x0);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"--enable-typed-function-references","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  local_2f8 = (ToolOptions *)local_2e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f8,"Deprecated compatibility flag","");
  local_720[0] = local_710;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"Tool options","");
  local_7c8 = 0;
  uStack_7c0 = 0;
  local_7b0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:116:12)>
              ::_M_invoke;
  local_7b8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:116:12)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add((string *)&pTVar5->super_Options,(string *)local_70,(string *)local_50
                              ,(string *)&local_2f8,(Arguments)local_720,(function *)0x0,
                              SUB81(&local_7c8,0));
  local_700[0] = local_6f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_700,"--disable-typed-function-references","");
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"");
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6c0,"Deprecated compatibility flag","");
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"Tool options","");
  local_7a8 = 0;
  uStack_7a0 = 0;
  local_790 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:126:12)>
              ::_M_invoke;
  local_798 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:126:12)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_700,(string *)local_6e0,(string *)local_6c0,
                              (Arguments)local_6a0,(function *)0x0,SUB81(&local_7a8,0));
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"--no-validation","");
  local_660[0] = local_650;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"-n","");
  local_640[0] = local_630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_640,"Disables validation, assumes inputs are correct","");
  local_620[0] = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"Tool options","");
  local_8a0 = 0;
  local_890 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:136:12)>
              ::_M_invoke;
  local_898 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:136:12)>
              ::_M_manager;
  local_8a8 = this;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_680,(string *)local_660,(string *)local_640,
                              (Arguments)local_620,(function *)0x0,SUB81(&local_8a8,0));
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"--pass-arg","");
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"-pa","");
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5c0,
             "An argument passed along to optimization passes being run. Must be in the form KEY@VALUE.  If KEY is the name of a pass then it applies to the closest instance of that pass before us. If KEY is not the name of a pass then it is a global option that applies to all pass instances that read it."
             ,"");
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"Tool options","");
  local_880 = 0;
  local_870 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:148:12)>
              ::_M_invoke;
  local_878 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:148:12)>
              ::_M_manager;
  local_888 = this;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_600,(string *)local_5e0,(string *)local_5c0,
                              (Arguments)local_5a0,(function *)0x2,SUB81(&local_888,0));
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"--closed-world","");
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"-cw","");
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_540,
             "Assume code outside of the module does not inspect or interact with GC and function references, even if they are passed out. The outside may hold on to them and pass them back in, but not inspect their contents or call them."
             ,"");
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"Tool options","");
  local_860 = 0;
  local_850 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:170:9)>
              ::_M_invoke;
  local_858 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:170:9)>
              ::_M_manager;
  local_868 = this;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_580,(string *)local_560,(string *)local_540,
                              (Arguments)local_520,(function *)0x0,SUB81(&local_868,0));
  local_500[0] = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"--preserve-type-order","");
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"");
  local_4c0[0] = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c0,
             "Preserve the order of types from the input (useful for debugging and testing)","");
  local_4a0[0] = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"Tool options","");
  local_840 = 0;
  local_830 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:180:9)>
              ::_M_invoke;
  local_838 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:180:9)>
              ::_M_manager;
  local_848 = this;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_500,(string *)local_4e0,(string *)local_4c0,
                              (Arguments)local_4a0,(function *)0x0,SUB81(&local_848,0));
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"--generate-stack-ir","");
  local_460[0] = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"");
  local_440[0] = local_430;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_440,"generate StackIR during writing","");
  local_420[0] = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"Tool options","");
  local_820 = 0;
  local_810 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:188:12)>
              ::_M_invoke;
  local_818 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:188:12)>
              ::_M_manager;
  local_828 = this;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_480,(string *)local_460,(string *)local_440,
                              (Arguments)local_420,(function *)0x0,SUB81(&local_828,0));
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"--optimize-stack-ir","");
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"");
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c0,"optimize StackIR during writing","");
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"Tool options","");
  local_800 = 0;
  local_7f0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:196:12)>
              ::_M_invoke;
  local_7f8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:196:12)>
              ::_M_manager;
  local_808 = this;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_400,(string *)local_3e0,(string *)local_3c0,
                              (Arguments)local_3a0,(function *)0x0,SUB81(&local_808,0));
  local_780[0] = local_770;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_780,"--print-stack-ir","");
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"");
  local_760[0] = local_750;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_760,"print StackIR during writing","");
  local_740[0] = local_730;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_740,"Tool options","");
  local_7e0 = 0;
  local_7d0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:206:12)>
              ::_M_invoke;
  local_7d8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:206:12)>
              ::_M_manager;
  local_7e8 = this;
  wasm::Options::add(psVar4,(string *)local_780,(string *)local_380,(string *)local_760,
                     (Arguments)local_740,(function *)0x0,SUB81(&local_7e8,0));
  if (local_7d8 != (code *)0x0) {
    (*local_7d8)(&local_7e8,&local_7e8,3);
  }
  if (local_740[0] != local_730) {
    operator_delete(local_740[0],local_730[0] + 1);
  }
  if (local_760[0] != local_750) {
    operator_delete(local_760[0],local_750[0] + 1);
  }
  if (local_380[0] != local_370) {
    operator_delete(local_380[0],local_370[0] + 1);
  }
  if (local_780[0] != local_770) {
    operator_delete(local_780[0],local_770[0] + 1);
  }
  if (local_7f8 != (code *)0x0) {
    (*local_7f8)(&local_808,&local_808,3);
  }
  if (local_3a0[0] != local_390) {
    operator_delete(local_3a0[0],local_390[0] + 1);
  }
  if (local_3c0[0] != local_3b0) {
    operator_delete(local_3c0[0],local_3b0[0] + 1);
  }
  if (local_3e0[0] != local_3d0) {
    operator_delete(local_3e0[0],local_3d0[0] + 1);
  }
  if (local_400[0] != local_3f0) {
    operator_delete(local_400[0],local_3f0[0] + 1);
  }
  if (local_818 != (code *)0x0) {
    (*local_818)(&local_828,&local_828,3);
  }
  if (local_420[0] != local_410) {
    operator_delete(local_420[0],local_410[0] + 1);
  }
  if (local_440[0] != local_430) {
    operator_delete(local_440[0],local_430[0] + 1);
  }
  if (local_460[0] != local_450) {
    operator_delete(local_460[0],local_450[0] + 1);
  }
  if (local_480[0] != local_470) {
    operator_delete(local_480[0],local_470[0] + 1);
  }
  if (local_838 != (code *)0x0) {
    (*local_838)(&local_848,&local_848,3);
  }
  if (local_4a0[0] != local_490) {
    operator_delete(local_4a0[0],local_490[0] + 1);
  }
  if (local_4c0[0] != local_4b0) {
    operator_delete(local_4c0[0],local_4b0[0] + 1);
  }
  if (local_4e0[0] != local_4d0) {
    operator_delete(local_4e0[0],local_4d0[0] + 1);
  }
  if (local_500[0] != local_4f0) {
    operator_delete(local_500[0],local_4f0[0] + 1);
  }
  if (local_858 != (code *)0x0) {
    (*local_858)(&local_868,&local_868,3);
  }
  if (local_520[0] != local_510) {
    operator_delete(local_520[0],local_510[0] + 1);
  }
  if (local_540[0] != local_530) {
    operator_delete(local_540[0],local_530[0] + 1);
  }
  if (local_560[0] != local_550) {
    operator_delete(local_560[0],local_550[0] + 1);
  }
  if (local_580[0] != local_570) {
    operator_delete(local_580[0],local_570[0] + 1);
  }
  if (local_878 != (code *)0x0) {
    (*local_878)(&local_888,&local_888,3);
  }
  if (local_5a0[0] != local_590) {
    operator_delete(local_5a0[0],local_590[0] + 1);
  }
  if (local_5c0[0] != local_5b0) {
    operator_delete(local_5c0[0],local_5b0[0] + 1);
  }
  if (local_5e0[0] != local_5d0) {
    operator_delete(local_5e0[0],local_5d0[0] + 1);
  }
  if (local_600[0] != local_5f0) {
    operator_delete(local_600[0],local_5f0[0] + 1);
  }
  if (local_898 != (code *)0x0) {
    (*local_898)(&local_8a8,&local_8a8,3);
  }
  if (local_620[0] != local_610) {
    operator_delete(local_620[0],local_610[0] + 1);
  }
  if (local_640[0] != local_630) {
    operator_delete(local_640[0],local_630[0] + 1);
  }
  if (local_660[0] != local_650) {
    operator_delete(local_660[0],local_650[0] + 1);
  }
  if (local_680[0] != local_670) {
    operator_delete(local_680[0],local_670[0] + 1);
  }
  if (local_798 != (code *)0x0) {
    (*local_798)(&local_7a8,&local_7a8,3);
  }
  if (local_6a0[0] != local_690) {
    operator_delete(local_6a0[0],local_690[0] + 1);
  }
  if (local_6c0[0] != local_6b0) {
    operator_delete(local_6c0[0],local_6b0[0] + 1);
  }
  if (local_6e0[0] != local_6d0) {
    operator_delete(local_6e0[0],local_6d0[0] + 1);
  }
  if (local_700[0] != local_6f0) {
    operator_delete(local_700[0],local_6f0[0] + 1);
  }
  if (local_7b8 != (code *)0x0) {
    (*local_7b8)(&local_7c8,&local_7c8,3);
  }
  if (local_720[0] != local_710) {
    operator_delete(local_720[0],local_710[0] + 1);
  }
  if (local_2f8 != (ToolOptions *)local_2e8) {
    operator_delete(local_2f8,(ulong)(local_2e8._0_8_ + 1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_318._0_8_ != local_308) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_308._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_2d8._0_8_ != local_2c8) {
    operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_338._0_8_ != local_328) {
    operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_358._0_8_ != local_348) {
    operator_delete((void *)local_358._0_8_,(ulong)(local_348._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ToolOptions(const std::string& command, const std::string& description)
    : Options(command, description) {
    (*this)
      .add("--mvp-features",
           "-mvp",
           "Disable all non-MVP features",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) {
             enabledFeatures.setMVP();
             disabledFeatures.setAll();
           })
      .add("--all-features",
           "-all",
           "Enable all features",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) {
             enabledFeatures.setAll();
             disabledFeatures.setMVP();
           })
      .add("--detect-features",
           "",
           "(deprecated - this flag does nothing)",
           ToolOptionsCategory,
           Arguments::Zero,
           [](Options*, const std::string&) {})
      .add("--quiet",
           "-q",
           "Emit less verbose output and hide trivial warnings.",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) { quiet = true; })
      .add(
        "--experimental-poppy",
        "",
        "Parse wast files as Poppy IR for testing purposes.",
        ToolOptionsCategory,
        Arguments::Zero,
        [this](Options*, const std::string&) { profile = IRProfile::Poppy; });
    (*this)
      .addFeature(FeatureSet::SignExt, "sign extension operations")
      .addFeature(FeatureSet::Atomics, "atomic operations")
      .addFeature(FeatureSet::MutableGlobals, "mutable globals")
      .addFeature(FeatureSet::TruncSat, "nontrapping float-to-int operations")
      .addFeature(FeatureSet::SIMD, "SIMD operations and types")
      .addFeature(FeatureSet::BulkMemory,
                  "bulk memory operations",
                  FeatureSet(FeatureSet::BulkMemoryOpt))
      .addFeature(FeatureSet::BulkMemoryOpt,
                  "memory.copy and memory.fill",
                  FeatureSet::None,
                  FeatureSet(FeatureSet::BulkMemory))
      .addFeature(FeatureSet::CallIndirectOverlong,
                  "LEB encoding of call-indirect (Ignored for compatibility as "
                  "it has no effect on Binaryen)")
      .addFeature(FeatureSet::ExceptionHandling,
                  "exception handling operations")
      .addFeature(FeatureSet::TailCall, "tail call operations")
      .addFeature(FeatureSet::ReferenceTypes, "reference types")
      .addFeature(FeatureSet::Multivalue, "multivalue functions")
      .addFeature(FeatureSet::GC, "garbage collection")
      .addFeature(FeatureSet::Memory64, "memory64")
      .addFeature(FeatureSet::RelaxedSIMD, "relaxed SIMD")
      .addFeature(FeatureSet::ExtendedConst, "extended const expressions")
      .addFeature(FeatureSet::Strings, "strings")
      .addFeature(FeatureSet::MultiMemory, "multimemory")
      .addFeature(FeatureSet::StackSwitching, "stack switching")
      .addFeature(FeatureSet::SharedEverything, "shared-everything threads")
      .addFeature(FeatureSet::FP16, "float 16 operations")
      .addFeature(FeatureSet::CustomDescriptors,
                  "custom descriptors (RTTs) and exact references")
      .add("--enable-typed-function-references",
           "",
           "Deprecated compatibility flag",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             std::cerr
               << "Warning: Typed function references have been made part of "
                  "GC and --enable-typed-function-references is deprecated\n";
           })
      .add("--disable-typed-function-references",
           "",
           "Deprecated compatibility flag",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             std::cerr
               << "Warning: Typed function references have been made part of "
                  "GC and --disable-typed-function-references is deprecated\n";
           })
      .add("--no-validation",
           "-n",
           "Disables validation, assumes inputs are correct",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [this](Options* o, const std::string& argument) {
             passOptions.validate = false;
           })
      .add("--pass-arg",
           "-pa",
           "An argument passed along to optimization passes being run. Must be "
           "in the form KEY@VALUE.  If KEY is the name of a pass then it "
           "applies to the closest instance of that pass before us. If KEY is "
           "not the name of a pass then it is a global option that applies to "
           "all pass instances that read it.",
           ToolOptionsCategory,
           Options::Arguments::N,
           [this](Options*, const std::string& argument) {
             std::string key, value;
             auto colon = argument.find('@');
             if (colon == std::string::npos) {
               key = argument;
               value = "1";
             } else {
               key = argument.substr(0, colon);
               value = argument.substr(colon + 1);
             }

             addPassArg(key, value);
           })
      .add(
        "--closed-world",
        "-cw",
        "Assume code outside of the module does not inspect or interact with "
        "GC and function references, even if they are passed out. The outside "
        "may hold on to them and pass them back in, but not inspect their "
        "contents or call them.",
        ToolOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.closedWorld = true;
        })
      .add(
        "--preserve-type-order",
        "",
        "Preserve the order of types from the input (useful for debugging and "
        "testing)",
        ToolOptionsCategory,
        Options::Arguments::Zero,
        [&](Options* o, const std::string& arguments) {
          preserveTypeOrder = true;
        })
      .add("--generate-stack-ir",
           "",
           "generate StackIR during writing",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             passOptions.generateStackIR = true;
           })
      .add("--optimize-stack-ir",
           "",
           "optimize StackIR during writing",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             // Also generate StackIR, to have something to optimize.
             passOptions.generateStackIR = true;
             passOptions.optimizeStackIR = true;
           })
      .add("--print-stack-ir",
           "",
           "print StackIR during writing",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             // Also generate StackIR, to have something to print.
             passOptions.generateStackIR = true;
             passOptions.printStackIR = &std::cout;
           });
  }